

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

void __thiscall Js::ParseableFunctionInfo::SetDeferredParsingEntryPoint(ParseableFunctionInfo *this)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  ProxyEntryPointInfo *entryPoint;
  ParseableFunctionInfo *this_local;
  
  if ((((this->super_FunctionProxy).m_scriptContext)->DeferredParsingThunk !=
       ScriptContext::ProfileModeDeferredParsingThunk) &&
     (((this->super_FunctionProxy).m_scriptContext)->DeferredParsingThunk !=
      JavascriptFunction::DeferredParsingThunk)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0xeb8,
                                "(m_scriptContext->DeferredParsingThunk == Js::ScriptContext::ProfileModeDeferredParsingThunk || m_scriptContext->DeferredParsingThunk == Js::JavascriptFunction::DeferredParsingThunk)"
                                ,
                                "m_scriptContext->DeferredParsingThunk == ProfileDeferredParsingThunk || m_scriptContext->DeferredParsingThunk == DefaultDeferredParsingThunk"
                               );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  entryPoint = FunctionProxy::GetDefaultEntryPointInfo(&this->super_FunctionProxy);
  SetEntryPoint(this,entryPoint,((this->super_FunctionProxy).m_scriptContext)->DeferredParsingThunk)
  ;
  FunctionProxy::SetOriginalEntryPoint
            (&this->super_FunctionProxy,JavascriptFunction::DeferredParsingThunk);
  return;
}

Assistant:

void ParseableFunctionInfo::SetDeferredParsingEntryPoint()
    {
#if defined(ENABLE_SCRIPT_PROFILING) || defined(ENABLE_SCRIPT_DEBUGGING)
        Assert(m_scriptContext->DeferredParsingThunk == ProfileDeferredParsingThunk
            || m_scriptContext->DeferredParsingThunk == DefaultDeferredParsingThunk);
#else
        Assert(m_scriptContext->DeferredParsingThunk == DefaultDeferredParsingThunk);
#endif

        this->SetEntryPoint(this->GetDefaultEntryPointInfo(), m_scriptContext->DeferredParsingThunk);
        this->SetOriginalEntryPoint(DefaultDeferredParsingThunk);
    }